

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O3

int mbedtls_dhm_parse_dhmfile(mbedtls_dhm_context *dhm,char *path)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uchar *dhmin;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  size_t __size;
  
  __stream = fopen(path,"rb");
  iVar1 = -0x3480;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar2 = ftell(__stream);
    if (sVar2 == 0xffffffffffffffff) {
      fclose(__stream);
    }
    else {
      fseek(__stream,0,0);
      __size = sVar2 + 1;
      dhmin = (uchar *)calloc(1,__size);
      if (dhmin == (uchar *)0x0) {
        fclose(__stream);
        iVar1 = -0x3400;
      }
      else {
        sVar3 = fread(dhmin,1,sVar2,__stream);
        fclose(__stream);
        if (sVar3 == sVar2) {
          dhmin[sVar2] = '\0';
          pcVar4 = strstr((char *)dhmin,"-----BEGIN ");
          if (pcVar4 == (char *)0x0) {
            __size = sVar2;
          }
          iVar1 = mbedtls_dhm_parse_dhm(dhm,dhmin,__size);
          if (__size != 0) {
            sVar5 = 0;
            do {
              dhmin[sVar5] = '\0';
              sVar5 = sVar5 + 1;
            } while (__size != sVar5);
          }
        }
        else {
          sVar2 = 0;
          do {
            dhmin[sVar2] = '\0';
            sVar2 = sVar2 + 1;
          } while (__size != sVar2);
        }
        free(dhmin);
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_dhm_parse_dhmfile( mbedtls_dhm_context *dhm, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_dhm_parse_dhm( dhm, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}